

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

void gost_get_key(gost_ctx *c,byte *k)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    k[lVar1 * 4] = (char)c->mask[lVar1] + (char)c->key[lVar1];
    k[lVar1 * 4 + 1] = (byte)(c->mask[lVar1] + c->key[lVar1] >> 8);
    k[lVar1 * 4 + 2] = (byte)(c->mask[lVar1] + c->key[lVar1] >> 0x10);
    k[lVar1 * 4 + 3] = (byte)(c->mask[lVar1] + c->key[lVar1] >> 0x18);
  }
  return;
}

Assistant:

void gost_get_key(gost_ctx * c, byte * k)
{
    int i, j;
    for (i = 0, j = 0; i < 8; i++, j += 4) {
        k[j] = (byte)((c->key[i] + c->mask[i]) & 0xFF);
        k[j+1] = (byte)(((c->key[i] + c->mask[i]) >> 8 )& 0xFF);
        k[j+2] = (byte)(((c->key[i] + c->mask[i]) >> 16) & 0xFF);
        k[j+3] = (byte)(((c->key[i] + c->mask[i]) >> 24) & 0xFF);
    }
}